

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall glslang::HlslParseContext::finish(HlslParseContext *this)

{
  bool bVar1;
  reference pvVar2;
  HlslParseContext *this_local;
  
  bVar1 = std::
          vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
          ::empty(&(this->mipsOperatorMipArg).
                   super_vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                 );
  if (!bVar1) {
    pvVar2 = std::
             vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
             ::back(&(this->mipsOperatorMipArg).
                     super_vector<glslang::HlslParseContext::tMipsOperatorData,_glslang::pool_allocator<glslang::HlslParseContext::tMipsOperatorData>_>
                   );
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pvVar2,"unterminated mips operator:","");
  }
  removeUnusedStructBufferCounters(this);
  addPatchConstantInvocation(this);
  fixTextureShadowModes(this);
  finalizeAppendMethods(this);
  bVar1 = TIntermediate::needsLegalization
                    ((this->super_TParseContextBase).super_TParseVersions.intermediate);
  if ((bVar1) &&
     (((this->super_TParseContextBase).super_TParseVersions.messages & EShMsgHlslLegalization) !=
      EShMsgDefault)) {
    TInfoSinkBase::operator<<
              (&((this->super_TParseContextBase).super_TParseVersions.infoSink)->info,
               "WARNING: AST will form illegal SPIR-V; need to transform to legalize");
  }
  TParseContextBase::finish(&this->super_TParseContextBase);
  return;
}

Assistant:

void HlslParseContext::finish()
{
    // Error check: There was a dangling .mips operator.  These are not nested constructs in the grammar, so
    // cannot be detected there.  This is not strictly needed in a non-validating parser; it's just helpful.
    if (! mipsOperatorMipArg.empty()) {
        error(mipsOperatorMipArg.back().loc, "unterminated mips operator:", "", "");
    }

    removeUnusedStructBufferCounters();
    addPatchConstantInvocation();
    fixTextureShadowModes();
    finalizeAppendMethods();

    // Communicate out (esp. for command line) that we formed AST that will make
    // illegal AST SPIR-V and it needs transforms to legalize it.
    if (intermediate.needsLegalization() && (messages & EShMsgHlslLegalization))
        infoSink.info << "WARNING: AST will form illegal SPIR-V; need to transform to legalize";

    TParseContextBase::finish();
}